

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

Bucket __thiscall
QHashPrivate::Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_>::
findBucketWithHash<QRhiShaderStage>
          (Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *this,QRhiShaderStage *key,
          size_t hash)

{
  byte bVar1;
  Entry *pEVar2;
  bool bVar3;
  Span *pSVar4;
  ulong uVar5;
  Span *pSVar6;
  Bucket BVar7;
  
  uVar5 = this->numBuckets - 1 & hash;
  pSVar4 = this->spans + (uVar5 >> 7);
  uVar5 = (ulong)((uint)uVar5 & 0x7f);
  do {
    bVar1 = pSVar4->offsets[uVar5];
    if (bVar1 == 0xff) {
LAB_00583ed2:
      bVar3 = false;
    }
    else {
      pEVar2 = pSVar4->entries;
      if (*(Type *)pEVar2[bVar1].storage.data == key->m_type) {
        bVar3 = ::operator==((QShader *)(pEVar2[bVar1].storage.data + 8),&key->m_shader);
        if ((bVar3) && (*(Variant *)(pEVar2[bVar1].storage.data + 0x10) == key->m_shaderVariant))
        goto LAB_00583ed2;
      }
      uVar5 = uVar5 + 1;
      bVar3 = true;
      if (uVar5 == 0x80) {
        pSVar6 = pSVar4 + 1;
        pSVar4 = this->spans;
        if (((long)pSVar6 - (long)this->spans >> 4) * -0x71c71c71c71c71c7 - (this->numBuckets >> 7)
            != 0) {
          pSVar4 = pSVar6;
        }
        uVar5 = 0;
      }
    }
    if (!bVar3) {
      BVar7.index = uVar5;
      BVar7.span = pSVar4;
      return BVar7;
    }
  } while( true );
}

Assistant:

Bucket findBucketWithHash(const K &key, size_t hash) const noexcept
    {
        static_assert(std::is_same_v<std::remove_cv_t<Key>, K> ||
                QHashHeterogeneousSearch<std::remove_cv_t<Key>, K>::value);
        Q_ASSERT(numBuckets > 0);
        Bucket bucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
        // loop over the buckets until we find the entry we search for
        // or an empty slot, in which case we know the entry doesn't exist
        while (true) {
            size_t offset = bucket.offset();
            if (offset == SpanConstants::UnusedEntry) {
                return bucket;
            } else {
                Node &n = bucket.nodeAtOffset(offset);
                if (qHashEquals(n.key, key))
                    return bucket;
            }
            bucket.advanceWrapped(this);
        }
    }